

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_JUMP_AND_BITE(effect_handler_context_t *context)

{
  loc_conflict grid1;
  _Bool _Var1;
  wchar_t dam;
  uint32_t uVar2;
  monster *mon_00;
  char *dice_string;
  source origin;
  wchar_t local_ac;
  _Bool local_9d;
  wchar_t local_9c;
  char local_98 [2];
  _Bool dead;
  _Bool fear;
  wchar_t drain;
  char m_name [80];
  monster *mon;
  uint32_t local_30;
  wchar_t first_d;
  wchar_t d;
  loc_conflict grid;
  loc_conflict victim;
  wchar_t amount;
  effect_handler_context_t *context_local;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  uVar2 = Rand_div(8);
  local_9c = 0;
  local_9d = false;
  context->ident = true;
  _Var1 = target_set_closest(L'\x01',monster_is_living);
  if (_Var1) {
    target_get((loc *)&grid);
    mon_00 = target_get_monster();
    monster_desc(local_98,0x50,mon_00,L'\x15');
    for (local_30 = uVar2; (int)local_30 < (int)(uVar2 + 8); local_30 = local_30 + 1) {
      _first_d = (loc_conflict)loc_sum((loc)grid,ddgrid_ddd[(int)local_30 % 8]);
      _Var1 = square_isplayertrap((chunk *)cave,_first_d);
      if (((!_Var1) && (_Var1 = square_iswebbed((chunk *)cave,_first_d), !_Var1)) &&
         (_Var1 = square_isopen((chunk *)cave,_first_d), _Var1)) break;
    }
    if (local_30 == uVar2 + 8) {
      msg("Not enough room next to %s!",local_98);
      context_local._7_1_ = false;
    }
    else {
      sound(10);
      grid1.x = (player->grid).x;
      grid1.y = (player->grid).y;
      monster_swap(grid1,_first_d);
      player_handle_post_move(player,true,false);
      local_ac = dam;
      if (mon_00->hp + L'\x01' <= dam) {
        local_ac = mon_00->hp + L'\x01';
      }
      local_9c = local_ac;
      if (local_ac < L'\x01') {
        __assert_fail("drain > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-attack.c"
                      ,0x8a8,"_Bool effect_handler_JUMP_AND_BITE(effect_handler_context_t *)");
      }
      if (((player->opts).opt[3] & 1U) == 0) {
        msg("You bite %s.",local_98);
      }
      else {
        msg("You bite %s. (%d)",local_98,(ulong)(uint)local_ac);
      }
      _Var1 = mon_take_hit(mon_00,player,dam,&local_9d," is drained dry!");
      dice_string = format("%d",(ulong)(uint)local_9c);
      origin._4_4_ = 0;
      origin.what = (context->origin).what;
      origin.which.trap = (context->origin).which.trap;
      effect_simple(L'\x03',origin,dice_string,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
      player_inc_timed(player,L'\n',local_9c,false,false,false);
      if (_Var1) {
        target_set_location(L'\0',L'\0');
      }
      else {
        _Var1 = monster_is_visible(mon_00);
        if ((_Var1) && (message_pain(mon_00,dam), (local_9d & 1U) != 0)) {
          add_monster_message(mon_00,L'%',true);
        }
      }
      context_local._7_1_ = true;
    }
  }
  else {
    context_local._7_1_ = false;
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_JUMP_AND_BITE(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	struct loc victim, grid;
	int d, first_d = randint0(8);
	struct monster *mon = NULL;
	char m_name[80];
	int drain = 0;
	bool fear = false;
	bool dead = false;

	context->ident = true;

	/* Closest living monster */
	if (!target_set_closest(TARGET_KILL, monster_is_living)) {
		return false;
	}
	target_get(&victim);
	mon = target_get_monster();
	monster_desc(m_name, sizeof(m_name), mon, MDESC_TARG);

	/* Look next to the monster */
	for (d = first_d; d < first_d + 8; d++) {
		grid = loc_sum(victim, ddgrid_ddd[d % 8]);
		if (square_isplayertrap(cave, grid)) continue;
		if (square_iswebbed(cave, grid)) continue;
		if (square_isopen(cave, grid)) break;
	}

	/* Needed to be adjacent */
	if (d == first_d + 8) {
		msg("Not enough room next to %s!", m_name);
		return false;
	}

	/* Sound */
	sound(MSG_TELEPORT);

	/* Move player */
	monster_swap(player->grid, grid);
	player_handle_post_move(player, true, false);

	/* Now bite it */
	drain = MIN(mon->hp + 1, amount);
	assert(drain > 0);
	if (OPT(player, show_damage)) {
		msg("You bite %s. (%d)", m_name, drain);
	} else {
		msg("You bite %s.", m_name);
	}
	dead = mon_take_hit(mon, player, amount, &fear, " is drained dry!");

	/* Heal and nourish */
	effect_simple(EF_HEAL_HP, context->origin, format("%d", drain), 0, 0, 0,
				  0, 0, NULL);
	player_inc_timed(player, TMD_FOOD, drain, false, false, false);

	if (dead) {
		/* Cancel the targeting of the dead creature. */
		target_set_location(0, 0);
	} else if (monster_is_visible(mon)) {
		/* Handle fear for surviving monsters */
		message_pain(mon, amount);
		if (fear) {
			add_monster_message(mon, MON_MSG_FLEE_IN_TERROR, true);
		}
	}

	return true;
}